

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackArchiveGenerator.cxx
# Opt level: O0

int __thiscall
cmCPackArchiveGenerator::PackageComponents(cmCPackArchiveGenerator *this,bool ignoreGroup)

{
  cmCPackLog *pcVar1;
  bool bVar2;
  int iVar3;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponentGroup,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponentGroup>_>_>
  *this_00;
  reference component;
  vector<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_> *this_01;
  reference ppcVar4;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>_>
  *pmVar5;
  reference __rhs;
  ostream *poVar6;
  char *pcVar7;
  string local_1960 [32];
  string local_1940;
  undefined1 local_1920 [8];
  ostringstream cmCPackLog_msg_7;
  undefined1 local_17a8 [8];
  cmArchiveWrite archive_2;
  undefined1 local_16a8 [8];
  ostringstream cmCPackLog_msg_6;
  undefined1 local_1530 [8];
  cmGeneratedFileStream gf_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_12c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_12a8;
  undefined1 local_1288 [8];
  string packageFileName_2;
  string local_1260;
  string local_1240 [8];
  string localToplevel_1;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>
  *comp_2;
  iterator __end2_2;
  iterator __begin2_2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>_>
  *__range2_2;
  string local_11e0;
  undefined1 local_11c0 [8];
  ostringstream cmCPackLog_msg_5;
  undefined1 local_1048 [8];
  cmArchiveWrite archive_1;
  undefined1 local_f48 [8];
  ostringstream cmCPackLog_msg_4;
  undefined1 local_dd0 [8];
  cmGeneratedFileStream gf_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b48;
  undefined1 local_b28 [8];
  string packageFileName_1;
  string local_b00;
  string local_ae0 [8];
  string localToplevel;
  ostringstream local_aa0 [8];
  ostringstream cmCPackLog_msg_3;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>
  *comp_1;
  iterator __end2_1;
  iterator __begin2_1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>_>
  *__range2_1;
  cmCPackComponent *comp;
  const_iterator __end3;
  const_iterator __begin3;
  vector<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_> *__range3;
  string local_8c8;
  undefined1 local_8a8 [8];
  ostringstream cmCPackLog_msg_2;
  undefined1 local_730 [8];
  cmArchiveWrite archive;
  string local_648 [32];
  undefined1 local_628 [8];
  ostringstream cmCPackLog_msg_1;
  undefined1 local_4b0 [8];
  cmGeneratedFileStream gf;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  undefined1 local_208 [8];
  string packageFileName;
  ostringstream local_1b8 [8];
  ostringstream cmCPackLog_msg;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponentGroup>
  *compG;
  iterator __end2;
  iterator __begin2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponentGroup,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponentGroup>_>_>
  *__range2;
  bool ignoreGroup_local;
  cmCPackArchiveGenerator *this_local;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&(this->super_cmCPackGenerator).packageFileNames);
  if (ignoreGroup) {
    pmVar5 = &(this->super_cmCPackGenerator).Components;
    __end2_2 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>_>
               ::begin(pmVar5);
    comp_2 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>
              *)std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>_>
                ::end(pmVar5);
    while (bVar2 = std::operator!=(&__end2_2,(_Self *)&comp_2), bVar2) {
      localToplevel_1.field_2._8_8_ =
           std::
           _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>
           ::operator*(&__end2_2);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1260,"CPACK_TEMPORARY_DIRECTORY",
                 (allocator<char> *)(packageFileName_2.field_2._M_local_buf + 0xf));
      pcVar7 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_1260);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (local_1240,pcVar7,(allocator<char> *)(packageFileName_2.field_2._M_local_buf + 0xe)
                );
      std::allocator<char>::~allocator
                ((allocator<char> *)(packageFileName_2.field_2._M_local_buf + 0xe));
      std::__cxx11::string::~string((string *)&local_1260);
      std::allocator<char>::~allocator
                ((allocator<char> *)(packageFileName_2.field_2._M_local_buf + 0xf));
      std::__cxx11::string::string
                ((string *)local_1288,(string *)&(this->super_cmCPackGenerator).toplevel);
      std::operator+(&local_12a8,"/",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     localToplevel_1.field_2._8_8_);
      std::__cxx11::string::operator+=(local_1240,(string *)&local_12a8);
      std::__cxx11::string::~string((string *)&local_12a8);
      GetArchiveComponentFileName
                ((string *)&gf_2.field_0x240,this,(string *)localToplevel_1.field_2._8_8_,false);
      std::operator+(&local_12c8,"/",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &gf_2.field_0x240);
      std::__cxx11::string::operator+=((string *)local_1288,(string *)&local_12c8);
      std::__cxx11::string::~string((string *)&local_12c8);
      std::__cxx11::string::~string((string *)&gf_2.field_0x240);
      cmGeneratedFileStream::cmGeneratedFileStream((cmGeneratedFileStream *)local_1530,None);
      cmGeneratedFileStream::Open
                ((cmGeneratedFileStream *)local_1530,(string *)local_1288,false,true);
      iVar3 = (*(this->super_cmCPackGenerator)._vptr_cmCPackGenerator[0x1d])(this,local_1530);
      if (iVar3 == 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_16a8);
        poVar6 = std::operator<<((ostream *)local_16a8,"Problem to generate Header for archive <");
        poVar6 = std::operator<<(poVar6,(string *)local_1288);
        poVar6 = std::operator<<(poVar6,">.");
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        pcVar1 = (this->super_cmCPackGenerator).Logger;
        std::__cxx11::ostringstream::str();
        pcVar7 = (char *)std::__cxx11::string::c_str();
        cmCPackLog::Log(pcVar1,0x10,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cmCPackArchiveGenerator.cxx"
                        ,0xbd,pcVar7);
        std::__cxx11::string::~string((string *)&archive_2.PermissionsMask);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_16a8);
        this_local._4_4_ = 0;
        archive.PermissionsMask.IsValueSet = true;
        archive.PermissionsMask._5_3_ = 0;
      }
      else {
        cmArchiveWrite::cmArchiveWrite
                  ((cmArchiveWrite *)local_17a8,(ostream *)local_1530,this->Compress,
                   &this->ArchiveFormat);
        bVar2 = cmArchiveWrite::operator!((cmArchiveWrite *)local_17a8);
        if (bVar2) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1920);
          poVar6 = std::operator<<((ostream *)local_1920,"Problem to create archive <");
          poVar6 = std::operator<<(poVar6,(string *)local_1288);
          poVar6 = std::operator<<(poVar6,">, ERROR = ");
          cmArchiveWrite::GetError_abi_cxx11_(&local_1940,(cmArchiveWrite *)local_17a8);
          poVar6 = std::operator<<(poVar6,(string *)&local_1940);
          std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
          std::__cxx11::string::~string((string *)&local_1940);
          pcVar1 = (this->super_cmCPackGenerator).Logger;
          std::__cxx11::ostringstream::str();
          pcVar7 = (char *)std::__cxx11::string::c_str();
          cmCPackLog::Log(pcVar1,0x10,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cmCPackArchiveGenerator.cxx"
                          ,0xbd,pcVar7);
          std::__cxx11::string::~string(local_1960);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1920);
          this_local._4_4_ = 0;
        }
        else {
          addOneComponentToArchive
                    (this,(cmArchiveWrite *)local_17a8,
                     (cmCPackComponent *)(localToplevel_1.field_2._8_8_ + 0x20));
        }
        archive.PermissionsMask._5_3_ = 0;
        archive.PermissionsMask.IsValueSet = bVar2;
        cmArchiveWrite::~cmArchiveWrite((cmArchiveWrite *)local_17a8);
      }
      cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_1530);
      if (archive.PermissionsMask._4_4_ == 0) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&(this->super_cmCPackGenerator).packageFileNames,(value_type *)local_1288);
        archive.PermissionsMask.IsValueSet = false;
        archive.PermissionsMask._5_3_ = 0;
      }
      std::__cxx11::string::~string((string *)local_1288);
      std::__cxx11::string::~string(local_1240);
      if (archive.PermissionsMask._4_4_ != 0) {
        return this_local._4_4_;
      }
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>
      ::operator++(&__end2_2);
    }
  }
  else {
    this_00 = &(this->super_cmCPackGenerator).ComponentGroups;
    __end2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponentGroup,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponentGroup>_>_>
             ::begin(this_00);
    compG = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponentGroup>
             *)std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponentGroup,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponentGroup>_>_>
               ::end(this_00);
    while (bVar2 = std::operator!=(&__end2,(_Self *)&compG), bVar2) {
      component = std::
                  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponentGroup>_>
                  ::operator*(&__end2);
      std::__cxx11::ostringstream::ostringstream(local_1b8);
      poVar6 = std::operator<<((ostream *)local_1b8,"Packaging component group: ");
      poVar6 = std::operator<<(poVar6,(string *)component);
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      pcVar1 = (this->super_cmCPackGenerator).Logger;
      std::__cxx11::ostringstream::str();
      pcVar7 = (char *)std::__cxx11::string::c_str();
      cmCPackLog::Log(pcVar1,2,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cmCPackArchiveGenerator.cxx"
                      ,0x83,pcVar7);
      std::__cxx11::string::~string((string *)(packageFileName.field_2._M_local_buf + 8));
      std::__cxx11::ostringstream::~ostringstream(local_1b8);
      std::__cxx11::string::string
                ((string *)&local_248,(string *)&(this->super_cmCPackGenerator).toplevel);
      std::operator+(&local_228,&local_248,"/");
      GetArchiveComponentFileName((string *)&gf.field_0x240,this,&component->first,true);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_208,
                     &local_228,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &gf.field_0x240);
      std::__cxx11::string::~string((string *)&gf.field_0x240);
      std::__cxx11::string::~string((string *)&local_228);
      std::__cxx11::string::~string((string *)&local_248);
      cmGeneratedFileStream::cmGeneratedFileStream((cmGeneratedFileStream *)local_4b0,None);
      cmGeneratedFileStream::Open((cmGeneratedFileStream *)local_4b0,(string *)local_208,false,true)
      ;
      iVar3 = (*(this->super_cmCPackGenerator)._vptr_cmCPackGenerator[0x1d])(this,local_4b0);
      if (iVar3 == 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_628);
        poVar6 = std::operator<<((ostream *)local_628,"Problem to generate Header for archive <");
        poVar6 = std::operator<<(poVar6,(string *)local_208);
        poVar6 = std::operator<<(poVar6,">.");
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        pcVar1 = (this->super_cmCPackGenerator).Logger;
        std::__cxx11::ostringstream::str();
        pcVar7 = (char *)std::__cxx11::string::c_str();
        cmCPackLog::Log(pcVar1,0x10,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cmCPackArchiveGenerator.cxx"
                        ,0x8b,pcVar7);
        std::__cxx11::string::~string(local_648);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_628);
        this_local._4_4_ = 0;
        archive.PermissionsMask.IsValueSet = true;
        archive.PermissionsMask._5_3_ = 0;
      }
      else {
        cmArchiveWrite::cmArchiveWrite
                  ((cmArchiveWrite *)local_730,(ostream *)local_4b0,this->Compress,
                   &this->ArchiveFormat);
        bVar2 = cmArchiveWrite::operator!((cmArchiveWrite *)local_730);
        if (bVar2) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_8a8);
          poVar6 = std::operator<<((ostream *)local_8a8,"Problem to create archive <");
          poVar6 = std::operator<<(poVar6,(string *)local_208);
          poVar6 = std::operator<<(poVar6,">, ERROR = ");
          cmArchiveWrite::GetError_abi_cxx11_(&local_8c8,(cmArchiveWrite *)local_730);
          poVar6 = std::operator<<(poVar6,(string *)&local_8c8);
          std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
          std::__cxx11::string::~string((string *)&local_8c8);
          pcVar1 = (this->super_cmCPackGenerator).Logger;
          std::__cxx11::ostringstream::str();
          pcVar7 = (char *)std::__cxx11::string::c_str();
          cmCPackLog::Log(pcVar1,0x10,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cmCPackArchiveGenerator.cxx"
                          ,0x8b,pcVar7);
          std::__cxx11::string::~string((string *)&__range3);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_8a8);
          this_local._4_4_ = 0;
          archive.PermissionsMask.IsValueSet = true;
          archive.PermissionsMask._5_3_ = 0;
        }
        else {
          this_01 = &(component->second).Components;
          __end3 = std::vector<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_>::begin
                             (this_01);
          comp = (cmCPackComponent *)
                 std::vector<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_>::end(this_01);
          while (bVar2 = __gnu_cxx::operator!=
                                   (&__end3,(__normal_iterator<cmCPackComponent_*const_*,_std::vector<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_>_>
                                             *)&comp), bVar2) {
            ppcVar4 = __gnu_cxx::
                      __normal_iterator<cmCPackComponent_*const_*,_std::vector<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_>_>
                      ::operator*(&__end3);
            addOneComponentToArchive(this,(cmArchiveWrite *)local_730,*ppcVar4);
            __gnu_cxx::
            __normal_iterator<cmCPackComponent_*const_*,_std::vector<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_>_>
            ::operator++(&__end3);
          }
          archive.PermissionsMask.IsValueSet = false;
          archive.PermissionsMask._5_3_ = 0;
        }
        cmArchiveWrite::~cmArchiveWrite((cmArchiveWrite *)local_730);
      }
      cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_4b0);
      if (archive.PermissionsMask._4_4_ == 0) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&(this->super_cmCPackGenerator).packageFileNames,(value_type *)local_208);
        archive.PermissionsMask.IsValueSet = false;
        archive.PermissionsMask._5_3_ = 0;
      }
      std::__cxx11::string::~string((string *)local_208);
      if (archive.PermissionsMask._4_4_ != 0) {
        return this_local._4_4_;
      }
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponentGroup>_>
      ::operator++(&__end2);
    }
    pmVar5 = &(this->super_cmCPackGenerator).Components;
    __end2_1 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>_>
               ::begin(pmVar5);
    comp_1 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>
              *)std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>_>
                ::end(pmVar5);
    while (bVar2 = std::operator!=(&__end2_1,(_Self *)&comp_1), bVar2) {
      __rhs = std::
              _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>
              ::operator*(&__end2_1);
      if ((__rhs->second).Group == (cmCPackComponentGroup *)0x0) {
        std::__cxx11::ostringstream::ostringstream(local_aa0);
        poVar6 = std::operator<<((ostream *)local_aa0,"Component <");
        poVar6 = std::operator<<(poVar6,(string *)&__rhs->second);
        poVar6 = std::operator<<(poVar6,"> does not belong to any group, package it separately.");
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        pcVar1 = (this->super_cmCPackGenerator).Logger;
        std::__cxx11::ostringstream::str();
        pcVar7 = (char *)std::__cxx11::string::c_str();
        cmCPackLog::Log(pcVar1,2,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cmCPackArchiveGenerator.cxx"
                        ,0x9e,pcVar7);
        std::__cxx11::string::~string((string *)(localToplevel.field_2._M_local_buf + 8));
        std::__cxx11::ostringstream::~ostringstream(local_aa0);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_b00,"CPACK_TEMPORARY_DIRECTORY",
                   (allocator<char> *)(packageFileName_1.field_2._M_local_buf + 0xf));
        pcVar7 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_b00);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (local_ae0,pcVar7,
                   (allocator<char> *)(packageFileName_1.field_2._M_local_buf + 0xe));
        std::allocator<char>::~allocator
                  ((allocator<char> *)(packageFileName_1.field_2._M_local_buf + 0xe));
        std::__cxx11::string::~string((string *)&local_b00);
        std::allocator<char>::~allocator
                  ((allocator<char> *)(packageFileName_1.field_2._M_local_buf + 0xf));
        std::__cxx11::string::string
                  ((string *)local_b28,(string *)&(this->super_cmCPackGenerator).toplevel);
        std::operator+(&local_b48,"/",&__rhs->first);
        std::__cxx11::string::operator+=(local_ae0,(string *)&local_b48);
        std::__cxx11::string::~string((string *)&local_b48);
        GetArchiveComponentFileName((string *)&gf_1.field_0x240,this,&__rhs->first,false);
        std::operator+(&local_b68,"/",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &gf_1.field_0x240);
        std::__cxx11::string::operator+=((string *)local_b28,(string *)&local_b68);
        std::__cxx11::string::~string((string *)&local_b68);
        std::__cxx11::string::~string((string *)&gf_1.field_0x240);
        cmGeneratedFileStream::cmGeneratedFileStream((cmGeneratedFileStream *)local_dd0,None);
        cmGeneratedFileStream::Open
                  ((cmGeneratedFileStream *)local_dd0,(string *)local_b28,false,true);
        iVar3 = (*(this->super_cmCPackGenerator)._vptr_cmCPackGenerator[0x1d])(this,local_dd0);
        if (iVar3 == 0) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_f48);
          poVar6 = std::operator<<((ostream *)local_f48,"Problem to generate Header for archive <");
          poVar6 = std::operator<<(poVar6,(string *)local_b28);
          poVar6 = std::operator<<(poVar6,">.");
          std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
          pcVar1 = (this->super_cmCPackGenerator).Logger;
          std::__cxx11::ostringstream::str();
          pcVar7 = (char *)std::__cxx11::string::c_str();
          cmCPackLog::Log(pcVar1,0x10,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cmCPackArchiveGenerator.cxx"
                          ,0xa8,pcVar7);
          std::__cxx11::string::~string((string *)&archive_1.PermissionsMask);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_f48);
          this_local._4_4_ = 0;
          archive.PermissionsMask.IsValueSet = true;
          archive.PermissionsMask._5_3_ = 0;
        }
        else {
          cmArchiveWrite::cmArchiveWrite
                    ((cmArchiveWrite *)local_1048,(ostream *)local_dd0,this->Compress,
                     &this->ArchiveFormat);
          bVar2 = cmArchiveWrite::operator!((cmArchiveWrite *)local_1048);
          if (bVar2) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_11c0);
            poVar6 = std::operator<<((ostream *)local_11c0,"Problem to create archive <");
            poVar6 = std::operator<<(poVar6,(string *)local_b28);
            poVar6 = std::operator<<(poVar6,">, ERROR = ");
            cmArchiveWrite::GetError_abi_cxx11_(&local_11e0,(cmArchiveWrite *)local_1048);
            poVar6 = std::operator<<(poVar6,(string *)&local_11e0);
            std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
            std::__cxx11::string::~string((string *)&local_11e0);
            pcVar1 = (this->super_cmCPackGenerator).Logger;
            std::__cxx11::ostringstream::str();
            pcVar7 = (char *)std::__cxx11::string::c_str();
            cmCPackLog::Log(pcVar1,0x10,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cmCPackArchiveGenerator.cxx"
                            ,0xa8,pcVar7);
            std::__cxx11::string::~string((string *)&__range2_2);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_11c0);
            this_local._4_4_ = 0;
          }
          else {
            addOneComponentToArchive(this,(cmArchiveWrite *)local_1048,&__rhs->second);
          }
          archive.PermissionsMask._5_3_ = 0;
          archive.PermissionsMask.IsValueSet = bVar2;
          cmArchiveWrite::~cmArchiveWrite((cmArchiveWrite *)local_1048);
        }
        cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_dd0);
        if (archive.PermissionsMask._4_4_ == 0) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&(this->super_cmCPackGenerator).packageFileNames,(value_type *)local_b28);
          archive.PermissionsMask.IsValueSet = false;
          archive.PermissionsMask._5_3_ = 0;
        }
        std::__cxx11::string::~string((string *)local_b28);
        std::__cxx11::string::~string(local_ae0);
        if (archive.PermissionsMask._4_4_ != 0) {
          return this_local._4_4_;
        }
      }
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>
      ::operator++(&__end2_1);
    }
  }
  return 1;
}

Assistant:

int cmCPackArchiveGenerator::PackageComponents(bool ignoreGroup)
{
  packageFileNames.clear();
  // The default behavior is to have one package by component group
  // unless CPACK_COMPONENTS_IGNORE_GROUP is specified.
  if (!ignoreGroup) {
    for (auto const& compG : this->ComponentGroups) {
      cmCPackLogger(cmCPackLog::LOG_VERBOSE,
                    "Packaging component group: " << compG.first << std::endl);
      // Begin the archive for this group
      std::string packageFileName = std::string(toplevel) + "/" +
        this->GetArchiveComponentFileName(compG.first, true);

      // open a block in order to automatically close archive
      // at the end of the block
      {
        DECLARE_AND_OPEN_ARCHIVE(packageFileName, archive);
        // now iterate over the component of this group
        for (cmCPackComponent* comp : (compG.second).Components) {
          // Add the files of this component to the archive
          addOneComponentToArchive(archive, comp);
        }
      }
      // add the generated package to package file names list
      packageFileNames.push_back(std::move(packageFileName));
    }
    // Handle Orphan components (components not belonging to any groups)
    for (auto& comp : this->Components) {
      // Does the component belong to a group?
      if (comp.second.Group == nullptr) {
        cmCPackLogger(
          cmCPackLog::LOG_VERBOSE,
          "Component <"
            << comp.second.Name
            << "> does not belong to any group, package it separately."
            << std::endl);
        std::string localToplevel(
          this->GetOption("CPACK_TEMPORARY_DIRECTORY"));
        std::string packageFileName = std::string(toplevel);

        localToplevel += "/" + comp.first;
        packageFileName +=
          "/" + this->GetArchiveComponentFileName(comp.first, false);

        {
          DECLARE_AND_OPEN_ARCHIVE(packageFileName, archive);
          // Add the files of this component to the archive
          addOneComponentToArchive(archive, &(comp.second));
        }
        // add the generated package to package file names list
        packageFileNames.push_back(std::move(packageFileName));
      }
    }
  }
  // CPACK_COMPONENTS_IGNORE_GROUPS is set
  // We build 1 package per component
  else {
    for (auto& comp : this->Components) {
      std::string localToplevel(this->GetOption("CPACK_TEMPORARY_DIRECTORY"));
      std::string packageFileName = std::string(toplevel);

      localToplevel += "/" + comp.first;
      packageFileName +=
        "/" + this->GetArchiveComponentFileName(comp.first, false);

      {
        DECLARE_AND_OPEN_ARCHIVE(packageFileName, archive);
        // Add the files of this component to the archive
        addOneComponentToArchive(archive, &(comp.second));
      }
      // add the generated package to package file names list
      packageFileNames.push_back(std::move(packageFileName));
    }
  }
  return 1;
}